

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhCursorKey(unqlite_kv_cursor *pCursor,_func_int_void_ptr_uint_void_ptr *xConsumer,
               void *pUserData)

{
  uint uVar1;
  lhcell *pCell;
  int iVar2;
  lhash_kv_cursor *pCur;
  
  if ((*(int *)&pCursor[1].pStore == 2) &&
     (pCell = (lhcell *)pCursor[2].pStore, pCell != (lhcell *)0x0)) {
    uVar1 = (pCell->sKey).nByte;
    if (uVar1 != 0) {
      iVar2 = (*xConsumer)((pCell->sKey).pBlob,uVar1,pUserData);
      return iVar2;
    }
    iVar2 = lhConsumeCellkey(pCell,xConsumer,pUserData,0);
    return iVar2;
  }
  return -9;
}

Assistant:

static int lhCursorKey(unqlite_kv_cursor *pCursor,int (*xConsumer)(const void *,unsigned int,void *),void *pUserData)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	int rc;
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Invalid state */
		return UNQLITE_INVALID;
	}
	/* Point to the target cell */
	pCell = pCur->pCell;
	if( SyBlobLength(&pCell->sKey) > 0 ){
		/* Consume the key directly */
		rc = xConsumer(SyBlobData(&pCell->sKey),SyBlobLength(&pCell->sKey),pUserData);
	}else{
		/* Very large key */
		rc = lhConsumeCellkey(pCell,xConsumer,pUserData,0);
	}
	return rc;
}